

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
bitmanip::detail::stringify_impl<unsigned_int,3ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,uint (*arr) [3])

{
  long lVar1;
  string result;
  string local_50;
  
  stringify_impl<unsigned_int>(&local_50,(uint *)this);
  std::operator+(&result,"{",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::reserve((ulong)&result);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 4) {
    std::__cxx11::string::append((char *)&result);
    stringify_impl<unsigned_int>(&local_50,(uint *)(this + lVar1 + 4));
    std::__cxx11::string::append((string *)&result);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator+(__return_storage_ptr__,&result,'}');
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

auto stringify_impl(const T (&arr)[N])
{
    std::string result = "{" + stringify_impl(arr[0]);
    result.reserve((result.length() + 1) * N + 1);

    for (std::size_t i = 1; i < N; ++i) {
        result += ", ";
        result += stringify_impl(arr[i]);
    }

    return result + '}';
}